

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O1

void __thiscall
embree::ParallelRadixSort<embree::sse2::PresplitItem,_unsigned_int>::tbbRadixIteration1
          (ParallelRadixSort<embree::sse2::PresplitItem,_unsigned_int> *this,uint shift,
          PresplitItem *src,PresplitItem *dst,size_t threadIndex,size_t threadCount)

{
  uint *puVar1;
  size_t sVar2;
  PresplitItem PVar3;
  uint uVar4;
  uint uVar5;
  size_t i;
  ulong uVar6;
  TyRadixCount *pauVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  uint offset [256];
  uint total [256];
  uint local_880 [256];
  uint local_480 [276];
  
  sVar2 = this->N;
  lVar12 = 0;
  memset(local_880 + 0x100,0,0x400);
  uVar6 = (sVar2 * threadIndex) / threadCount;
  pauVar7 = this->radixCount;
  do {
    uVar10 = 0xfffffffffffffffc;
    do {
      puVar1 = *pauVar7 + uVar10 + 4;
      uVar8 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      local_880[uVar10 + 0x104] = *puVar1 + local_880[uVar10 + 0x104];
      local_880[uVar10 + 0x105] = uVar8 + local_880[uVar10 + 0x105];
      local_880[uVar10 + 0x106] = uVar4 + local_880[uVar10 + 0x106];
      local_880[uVar10 + 0x107] = uVar5 + local_880[uVar10 + 0x107];
      uVar10 = uVar10 + 4;
    } while (uVar10 < 0xfc);
    lVar12 = lVar12 + 1;
    pauVar7 = pauVar7 + 1;
  } while (lVar12 != threadCount + (threadCount == 0));
  local_880[0] = 0;
  lVar12 = 1;
  uVar8 = 0;
  do {
    uVar8 = uVar8 + local_880[lVar12 + 0xff];
    local_880[lVar12] = uVar8;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x100);
  if (threadIndex != 0) {
    pauVar7 = this->radixCount;
    sVar11 = 0;
    do {
      uVar10 = 0xfffffffffffffffc;
      do {
        puVar1 = *pauVar7 + uVar10 + 4;
        uVar8 = puVar1[1];
        uVar4 = puVar1[2];
        uVar5 = puVar1[3];
        local_880[uVar10 + 4] = *puVar1 + local_880[uVar10 + 4];
        local_880[uVar10 + 5] = uVar8 + local_880[uVar10 + 5];
        local_880[uVar10 + 6] = uVar4 + local_880[uVar10 + 6];
        local_880[uVar10 + 7] = uVar5 + local_880[uVar10 + 7];
        uVar10 = uVar10 + 4;
      } while (uVar10 < 0xfc);
      sVar11 = sVar11 + 1;
      pauVar7 = pauVar7 + 1;
    } while (sVar11 != threadIndex);
  }
  for (; uVar6 < ((threadIndex + 1) * sVar2) / threadCount; uVar6 = uVar6 + 1) {
    PVar3 = src[uVar6];
    bVar9 = (byte)(src[uVar6].field_0.data >> ((byte)shift & 0x3f));
    uVar8 = local_880[bVar9];
    local_880[bVar9] = uVar8 + 1;
    dst[uVar8] = PVar3;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }